

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__8,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  string_view format;
  Arg local_78;
  Arg local_48;
  
  substitute_internal::Arg::Arg(&local_48,*(int *)(**(long **)this + 4));
  local_78.piece_._M_len = **(size_t **)(this + 8);
  local_78.piece_._M_str = (char *)(*(size_t **)(this + 8))[1];
  format._M_str = (char *)&local_48;
  format._M_len = (size_t)"Extension number $0 has already been used in \"$1\" by extension \"$2\"."
  ;
  Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&DAT_00000044,format,&local_78,
             (Arg *)&stack0xffffffffffffff58,
             (Arg *)(ulong)*(ushort *)(*(long *)(**(long **)(this + 0x10) + 8) + 2));
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}